

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_clib___newindex(lua_State *L)

{
  uint uVar1;
  ErrMsg EVar2;
  TValue *pTVar3;
  CType *o_00;
  long in_RDI;
  CTInfo qual;
  CType *d;
  GCcdata *cd;
  CTState *cts;
  TValue *o;
  TValue *tv;
  CTState *cts_1;
  ErrMsg in_stack_ffffffffffffff6c;
  lua_State *in_stack_ffffffffffffff70;
  lua_State *plVar4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  pTVar3 = ffi_clib_index(in_stack_ffffffffffffff70);
  if ((*(long *)(in_RDI + 0x10) + 0x10U < *(ulong *)(in_RDI + 0x18)) &&
     ((pTVar3->field_2).it == 0xfffffff5)) {
    o_00 = (CType *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x194);
    o_00[1].info = (int)in_RDI;
    o_00[1].size = (int)((ulong)in_RDI >> 0x20);
    in_stack_ffffffffffffff70 =
         (lua_State *)(*(long *)o_00 + (ulong)*(ushort *)((ulong)(pTVar3->u32).lo + 6) * 0x10);
    if ((in_stack_ffffffffffffff70->nextgc).gcptr32 >> 0x1c == 0xc) {
      in_stack_ffffffffffffff6c = LJ_ERR_ERRMEM;
      plVar4 = in_stack_ffffffffffffff70;
      while( true ) {
        uVar1 = (plVar4->nextgc).gcptr32;
        in_stack_ffffffffffffff70 = (lua_State *)(*(long *)o_00 + (ulong)(uVar1 & 0xffff) * 0x10);
        if ((in_stack_ffffffffffffff70->nextgc).gcptr32 >> 0x1c != 8) break;
        plVar4 = in_stack_ffffffffffffff70;
        if (((in_stack_ffffffffffffff70->nextgc).gcptr32 >> 0x10 & 0xff) == 1) {
          EVar2._0_1_ = in_stack_ffffffffffffff70->marked;
          EVar2._1_1_ = in_stack_ffffffffffffff70->gct;
          EVar2._2_1_ = in_stack_ffffffffffffff70->dummy_ffid;
          EVar2._3_1_ = in_stack_ffffffffffffff70->status;
          in_stack_ffffffffffffff6c = EVar2 | in_stack_ffffffffffffff6c;
        }
      }
      if ((((in_stack_ffffffffffffff70->nextgc).gcptr32 | in_stack_ffffffffffffff6c) & 0x2000000) ==
          LJ_ERR_ERRMEM) {
        lj_cconv_ct_tv((CTState *)(CONCAT44(uVar1,in_stack_ffffffffffffffe0) & 0xffffffffffff),o_00,
                       (uint8_t *)(CONCAT44(uVar1,in_stack_ffffffffffffffd0) & 0xffffffffffff),
                       (TValue *)o_00,(CTInfo)((ulong)plVar4 >> 0x20));
        return 0;
      }
    }
  }
  lj_err_caller(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
}

Assistant:

LJLIB_CF(ffi_clib___newindex)	LJLIB_REC(clib_index 0)
{
  TValue *tv = ffi_clib_index(L);
  TValue *o = L->base+2;
  if (o < L->top && tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *d = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(d->info)) {
      CTInfo qual = 0;
      for (;;) {  /* Skip attributes and collect qualifiers. */
	d = ctype_child(cts, d);
	if (!ctype_isattrib(d->info)) break;
	if (ctype_attrib(d->info) == CTA_QUAL) qual |= d->size;
      }
      if (!((d->info|qual) & CTF_CONST)) {
	lj_cconv_ct_tv(cts, d, *(void **)cdataptr(cd), o, 0);
	return 0;
      }
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_WRCONST);
  return 0;  /* unreachable */
}